

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

string * __thiscall llvm::Twine::str_abi_cxx11_(string *__return_storage_ptr__,Twine *this)

{
  StringRef local_138;
  undefined1 local_128 [8];
  SmallString<256U> Vec;
  Twine *this_local;
  
  Vec.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ = this;
  if ((this->LHSKind == StdStringKind) && (this->RHSKind == EmptyKind)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->LHS).twine);
  }
  else if ((this->LHSKind == FormatvObjectKind) && (this->RHSKind == EmptyKind)) {
    formatv_object_base::str_abi_cxx11_(__return_storage_ptr__,(this->LHS).formatvObject);
  }
  else {
    SmallString<256U>::SmallString((SmallString<256U> *)local_128);
    local_138 = toStringRef(this,(SmallVectorImpl<char> *)local_128);
    StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_138);
    SmallString<256U>::~SmallString((SmallString<256U> *)local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Twine::str() const {
  // If we're storing only a std::string, just return it.
  if (LHSKind == StdStringKind && RHSKind == EmptyKind)
    return *LHS.stdString;

  // If we're storing a formatv_object, we can avoid an extra copy by formatting
  // it immediately and returning the result.
  if (LHSKind == FormatvObjectKind && RHSKind == EmptyKind)
    return LHS.formatvObject->str();

  // Otherwise, flatten and copy the contents first.
  SmallString<256> Vec;
  return toStringRef(Vec).str();
}